

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O0

float ssd(qnode_ptr_t f,qnode_ptr_t g,int x1,int y1,int x2,int y2)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float local_44;
  int local_40;
  float s;
  int yr2;
  int xr2;
  int yr1;
  int xr1;
  int k2;
  int k1;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  qnode_ptr_t g_local;
  qnode_ptr_t f_local;
  
  local_44 = 0.0;
  for (xr1 = -kera.m / 2; xr1 <= kera.m / 2; xr1 = xr1 + 1) {
    if (x1 + xr1 < 0) {
      xr2 = 0;
    }
    else if (x1 + xr1 < f->sizy) {
      xr2 = x1 + xr1;
    }
    else {
      xr2 = f->sizy + -1;
    }
    if (x2 + xr1 < 0) {
      s = 0.0;
    }
    else if (x2 + xr1 < g->sizy) {
      s = (float)(x2 + xr1);
    }
    else {
      s = (float)(g->sizy + -1);
    }
    for (yr1 = -kera.m / 2; yr1 <= kera.m / 2; yr1 = yr1 + 1) {
      if (y1 + yr1 < 0) {
        yr2 = 0;
      }
      else if (y1 + yr1 < f->sizx) {
        yr2 = y1 + yr1;
      }
      else {
        yr2 = f->sizx + -1;
      }
      if (y2 + yr1 < 0) {
        local_40 = 0;
      }
      else if (y2 + yr1 < g->sizx) {
        local_40 = y2 + yr1;
      }
      else {
        local_40 = g->sizx + -1;
      }
      fVar1 = kera.k[xr1 + kera.m / 2];
      fVar2 = kera.k[yr1 + kera.m / 2];
      dVar3 = pow((double)((*f->lap_ptr)[f->res * xr2 + yr2] -
                          (*g->lap_ptr)[g->res * (int)s + local_40]),2.0);
      local_44 = (float)((double)(fVar1 * fVar2) * dVar3 + (double)local_44);
    }
  }
  return local_44 / (kera.f * kera.f);
}

Assistant:

float ssd(f,g,x1,y1,x2,y2)
qnode_ptr_t f, g ;
int x1, y1, x2, y2 ;

{ extern kernel_t kera ;
  int k1, k2, xr1, yr1, xr2, yr2 ;
  float s ;

  s = 0.0 ;
  for (k1 = -kera.m/2 ; k1 <= kera.m/2; k1++) {
    if (x1 + k1 < 0) {
      xr1 = 0 ;
    }
    else {
      if (x1 + k1 >= f->sizy) {
        xr1 = f->sizy - 1 ;
      }
      else {
        xr1 = x1 + k1 ;
      }
    }
    if (x2 + k1 < 0) {
      xr2 = 0 ;
    }
    else {
      if (x2 + k1 >= g->sizy) {
        xr2 = g->sizy - 1 ;
      }
      else {
        xr2 = x2 + k1 ;
      }
    }
    for (k2 = -kera.m/2 ; k2 <= kera.m/2 ; k2++) {
      if (y1 + k2 < 0) {
        yr1 = 0 ;
      }
      else {
        if (y1 + k2 >= f->sizx) {
          yr1 = f->sizx - 1 ;
        }
        else {
          yr1 = y1 + k2 ;
        }
      }
      if (y2 + k2 < 0) {
        yr2 = 0 ;
      }
      else {
        if (y2 + k2 >= g->sizx) {
          yr2 = g->sizx - 1 ;
        }
        else {
          yr2 = y2 + k2 ;
        }
      }
      s = s + (float)kera.k[k1+kera.m/2]*(float)kera.k[k2+kera.m/2]*
      pow(((*f->lap_ptr)[f->res*xr1 + yr1] -
           (*g->lap_ptr)[g->res*xr2 + yr2]),2.0) ;
    }
  }
  return(s/(kera.f*kera.f)) ;
}